

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper * __thiscall
Js::JavascriptLibrary::CreateAlreadyCalledWrapper_TTD
          (JavascriptLibrary *this,ScriptContext *ctx,bool value)

{
  Recycler *pRVar1;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *pJVar2;
  TrackAllocData local_50;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper;
  ScriptContext *pSStack_18;
  bool value_local;
  ScriptContext *ctx_local;
  JavascriptLibrary *this_local;
  
  alreadyCalledWrapper._7_1_ = value;
  pSStack_18 = ctx;
  ctx_local = (ScriptContext *)this;
  pRVar1 = ScriptContext::GetRecycler(ctx);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,
             (type_info *)&JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo,
             0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1625);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  pJVar2 = (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
           new<Memory::Recycler>(1,pRVar1,0x744a10);
  pJVar2->alreadyResolved = (Type)(alreadyCalledWrapper._7_1_ & 1);
  return pJVar2;
}

Assistant:

JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* JavascriptLibrary::CreateAlreadyCalledWrapper_TTD(Js::ScriptContext* ctx, bool value)
    {
        JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = RecyclerNewStructZ(ctx->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
        alreadyCalledWrapper->alreadyResolved = value;

        return alreadyCalledWrapper;
    }